

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmc_blocking_q.h
# Opt level: O2

void __thiscall
spdlog::details::mpmc_blocking_queue<spdlog::details::async_msg>::dequeue
          (mpmc_blocking_queue<spdlog::details::async_msg> *this,async_msg *popped_item)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> uStack_28;
  
  std::unique_lock<std::mutex>::unique_lock(&uStack_28,&this->queue_mutex_);
  std::condition_variable::
  wait<spdlog::details::mpmc_blocking_queue<spdlog::details::async_msg>::dequeue(spdlog::details::async_msg&)::_lambda()_1_>
            (&this->push_cv_,&uStack_28,(anon_class_8_1_8991fb9c)this);
  async_msg::operator=
            (popped_item,
             (this->q_).v_.
             super__Vector_base<spdlog::details::async_msg,_std::allocator<spdlog::details::async_msg>_>
             ._M_impl.super__Vector_impl_data._M_start + (this->q_).head_);
  (this->q_).head_ = ((this->q_).head_ + 1) % (this->q_).max_items_;
  std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  std::condition_variable::notify_one();
  return;
}

Assistant:

void dequeue(T &popped_item) {
        {
            std::unique_lock<std::mutex> lock(queue_mutex_);
            push_cv_.wait(lock, [this] { return !this->q_.empty(); });
            popped_item = std::move(q_.front());
            q_.pop_front();
        }
        pop_cv_.notify_one();
    }